

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOcontroller.h
# Opt level: O2

string * IOcontroller::get_out_file_name
                   (string *__return_storage_ptr__,string *graphName,string *algName,int seedsize,
                   string *probDist,float probEdge)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  bVar1 = std::operator==(probDist,"UNI");
  if (bVar1) {
    std::operator+(&local_b0,graphName,"_");
    std::operator+(&local_90,&local_b0,algName);
    std::operator+(&local_130,&local_90,"_k");
    std::__cxx11::to_string(&local_50,seedsize);
    std::operator+(&local_110,&local_130,&local_50);
    std::operator+(&local_f0,&local_110,"_");
    std::operator+(&local_d0,&local_f0,probDist);
    std::__cxx11::to_string(&local_70,probEdge);
    std::operator+(__return_storage_ptr__,&local_d0,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_90);
    this = &local_b0;
  }
  else {
    std::operator+(&local_90,graphName,"_");
    std::operator+(&local_130,&local_90,algName);
    std::operator+(&local_110,&local_130,"_k");
    std::__cxx11::to_string(&local_b0,seedsize);
    std::operator+(&local_f0,&local_110,&local_b0);
    std::operator+(&local_d0,&local_f0,"_");
    std::operator+(__return_storage_ptr__,&local_d0,probDist);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    this = &local_90;
  }
  std::__cxx11::string::~string((string *)this);
  return __return_storage_ptr__;
}

Assistant:

static std::string get_out_file_name(const std::string graphName, const std::string algName, const int seedsize,
                                         const std::string probDist, const float probEdge)
    {
        if (probDist == "UNI")
        {
            return graphName + "_" + algName + "_k" + std::to_string(seedsize) + "_" + probDist + std::
            to_string(probEdge);
        }
        return graphName + "_" + algName + "_k" + std::to_string(seedsize) + "_" + probDist;
    }